

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void simpleExpression(item *x)

{
  int op_00;
  item *x_00;
  bool bVar1;
  item *y;
  int op;
  item *x_local;
  
  x_00 = (item *)calloc(1,0x30);
  if (currentSymbol == 0x62) {
    getSymbol();
    term(x);
    if (currentSymbol == 0x1f8) {
      mark("negative character ?");
      exit(-1);
    }
    opOne(0x62,x);
  }
  else {
    term(x);
  }
  while( true ) {
    op_00 = currentSymbol;
    bVar1 = true;
    if ((currentSymbol != 0x62) && (bVar1 = true, currentSymbol != 0x61)) {
      bVar1 = currentSymbol == 0xc9;
    }
    if (!bVar1) break;
    getSymbol();
    if (op_00 == 0xc9) {
      opOne(0xc9,x);
    }
    term(x_00);
    opTwo(op_00,x,x_00);
    if ((op_00 == 0xc9) && (x->r != x_00->r)) {
      regs[x->r] = 0;
      x->r = x_00->r;
    }
  }
  return;
}

Assistant:

procedure
void simpleExpression(struct item *x) {
	variable int op;
	variable struct item *y;
	y = NULL; op = 0;
	allocMem(y);
	if (currentSymbol == SYMBOL_SUB) {
		getSymbol(); term(x);
		if (currentSymbol == SYMBOL_CHARACTERLITERAL) { /* no negative char */
			mark("negative character ?");
			exit(-1);
		} else {
			opOne(SYMBOL_SUB,x);
		}
	} else {
		term(x);
	}
	while ((currentSymbol == SYMBOL_SUB) || (currentSymbol == SYMBOL_ADD) || (currentSymbol == SYMBOL_OR)) {
		op = currentSymbol;
		getSymbol();
		if (op == SYMBOL_OR) {
			opOne(op,x);
		}
		term(y);
		opTwo(op,x,y);
		if (op == SYMBOL_OR) {
			if(x->r != y->r) {
				regs[x->r] = 0;
				x->r = y->r;
			}
		}
	}
}